

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O2

void __thiscall
spvtools::DiagnosticStream::DiagnosticStream(DiagnosticStream *this,DiagnosticStream *other)

{
  size_t sVar1;
  string asStack_38 [32];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->position_).index = (other->position_).index;
  sVar1 = (other->position_).column;
  (this->position_).line = (other->position_).line;
  (this->position_).column = sVar1;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&this->consumer_,&other->consumer_);
  std::__cxx11::string::string
            ((string *)&this->disassembled_instruction_,(string *)&other->disassembled_instruction_)
  ;
  this->error_ = other->error_;
  other->error_ = SPV_FAILED_MATCH;
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this,asStack_38);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

DiagnosticStream::DiagnosticStream(DiagnosticStream&& other)
    : stream_(),
      position_(other.position_),
      consumer_(other.consumer_),
      disassembled_instruction_(std::move(other.disassembled_instruction_)),
      error_(other.error_) {
  // Prevent the other object from emitting output during destruction.
  other.error_ = SPV_FAILED_MATCH;
  // Some platforms are missing support for std::ostringstream functionality,
  // including:  move constructor, swap method.  Either would have been a
  // better choice than copying the string.
  stream_ << other.stream_.str();
}